

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t
ctrl_set_frame_periodic_boost(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  aom_codec_err_t aVar2;
  av1_extracfg *extra_cfg_00;
  aom_codec_alg_priv_t_conflict *in_RSI;
  long in_RDI;
  av1_extracfg extra_cfg;
  undefined1 local_268 [216];
  int local_190;
  aom_codec_alg_priv_t_conflict *local_10;
  
  local_10 = in_RSI;
  memcpy(local_268,(void *)(in_RDI + 0x458),600);
  uVar1 = *(uint *)&(local_10->base).err_detail;
  if (uVar1 < 0x29) {
    extra_cfg_00 = (av1_extracfg *)
                   ((long)(int)uVar1 + (long)(local_10->base).enc.cx_data_dst_buf.buf);
    *(uint *)&(local_10->base).err_detail = uVar1 + 8;
  }
  else {
    extra_cfg_00 = (av1_extracfg *)(local_10->base).init_flags;
    (local_10->base).init_flags = (aom_codec_flags_t)&extra_cfg_00->enable_auto_bwd_ref;
  }
  local_190 = extra_cfg_00->cpu_used;
  aVar2 = update_extra_cfg(local_10,extra_cfg_00);
  return aVar2;
}

Assistant:

static aom_codec_err_t ctrl_set_frame_periodic_boost(aom_codec_alg_priv_t *ctx,
                                                     va_list args) {
  struct av1_extracfg extra_cfg = ctx->extra_cfg;
  extra_cfg.frame_periodic_boost = CAST(AV1E_SET_FRAME_PERIODIC_BOOST, args);
  return update_extra_cfg(ctx, &extra_cfg);
}